

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O1

void t3cbf(uint gpio,uint level,uint32_t tick)

{
  if (t3_reset == 0) {
    if (level == 0) {
      t3_on = (float)(tick - t3_tick) + t3_on;
    }
    else {
      t3_off = (float)(tick - t3_tick) + t3_off;
    }
  }
  else {
    t3_count = 0;
    t3_on = 0.0;
    t3_off = 0.0;
    t3_reset = 0;
  }
  t3_count = t3_count + 1;
  t3_tick = tick;
  return;
}

Assistant:

void t3cbf(unsigned gpio, unsigned level, uint32_t tick)
{
   uint32_t td;

   if (t3_reset)
   {
      t3_count = 0;
      t3_on = 0.0;
      t3_off = 0.0;
      t3_reset = 0;
   }
   else
   {
      td = tick - t3_tick;

      if (level == 0) t3_on += td;
      else            t3_off += td;
   }

   t3_count ++;
   t3_tick = tick;
}